

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(cbtAlignedObjectArray<cbtVector3> *this)

{
  if (this->m_data != (cbtVector3 *)0x0) {
    if (this->m_ownsMemory == true) {
      cbtAlignedFreeInternal(this->m_data);
    }
    this->m_data = (cbtVector3 *)0x0;
  }
  this->m_ownsMemory = true;
  this->m_data = (cbtVector3 *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}